

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6c37a::CommandLineParser::addOption
          (CommandLineParser *this,Option *O,SubCommand *SC)

{
  size_t *psVar1;
  pair<llvm::StringRef,_llvm::cl::Option_*> KV;
  bool bVar2;
  FormattingFlags FVar3;
  uint uVar4;
  NumOccurrencesFlag NVar5;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this_00;
  raw_ostream *prVar6;
  SubCommand *pSVar7;
  SubCommand *pSVar8;
  pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> pVar9;
  SubCommand *Sub;
  iterator __end3;
  iterator __begin3;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *__range3;
  Twine local_88;
  size_t local_70;
  void *local_68;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_60;
  byte local_58;
  pair<llvm::StringRef,_llvm::cl::Option_*> local_50;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_38;
  byte local_30;
  byte local_21;
  SubCommand *pSStack_20;
  bool HadErrors;
  SubCommand *SC_local;
  Option *O_local;
  CommandLineParser *this_local;
  
  local_21 = 0;
  pSStack_20 = SC;
  SC_local = (SubCommand *)O;
  O_local = (Option *)this;
  bVar2 = llvm::cl::Option::hasArgStr(O);
  if (bVar2) {
    this_00 = &pSStack_20->OptionsMap;
    std::make_pair<llvm::StringRef&,llvm::cl::Option*&>
              (&local_50,(StringRef *)&(SC_local->Description).Length,(Option **)&SC_local);
    KV.first.Length = local_50.first.Length;
    KV.first.Data = local_50.first.Data;
    KV.second = local_50.second;
    pVar9 = llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::insert(this_00,KV);
    local_60.Ptr = (StringMapEntryBase **)
                   pVar9.first.
                   super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
                   .Ptr;
    local_58 = pVar9.second;
    local_38.Ptr = local_60.Ptr;
    local_30 = local_58;
    if (((local_58 ^ 0xff) & 1) != 0) {
      prVar6 = llvm::errs();
      prVar6 = llvm::raw_ostream::operator<<(prVar6,&this->ProgramName);
      prVar6 = llvm::raw_ostream::operator<<(prVar6,": CommandLine Error: Option \'");
      psVar1 = &(SC_local->Description).Length;
      local_70 = *psVar1;
      local_68 = (SC_local->PositionalOpts).super_SmallVectorImpl<llvm::cl::Option_*>.
                 super_SmallVectorTemplateBase<llvm::cl::Option_*,_true>.
                 super_SmallVectorTemplateCommon<llvm::cl::Option_*,_void>.super_SmallVectorBase.
                 BeginX;
      prVar6 = llvm::raw_ostream::operator<<(prVar6,*(StringRef *)psVar1);
      llvm::raw_ostream::operator<<(prVar6,"\' registered more than once!\n");
      local_21 = 1;
    }
  }
  FVar3 = llvm::cl::Option::getFormattingFlag((Option *)SC_local);
  if (FVar3 == Positional) {
    llvm::SmallVectorTemplateBase<llvm::cl::Option_*,_true>::push_back
              ((SmallVectorTemplateBase<llvm::cl::Option_*,_true> *)&pSStack_20->PositionalOpts,
               (Option **)&SC_local);
  }
  else {
    uVar4 = llvm::cl::Option::getMiscFlags((Option *)SC_local);
    if ((uVar4 & 4) == 0) {
      NVar5 = llvm::cl::Option::getNumOccurrencesFlag((Option *)SC_local);
      pSVar8 = SC_local;
      if (NVar5 == ConsumeAfter) {
        if (pSStack_20->ConsumeAfterOpt != (Option *)0x0) {
          llvm::Twine::Twine(&local_88,"Cannot specify more than one option with cl::ConsumeAfter!")
          ;
          memset(&__range3,0,0x10);
          llvm::StringRef::StringRef((StringRef *)&__range3);
          prVar6 = llvm::errs();
          llvm::cl::Option::error((Option *)pSVar8,&local_88,___range3,prVar6);
          local_21 = 1;
        }
        pSStack_20->ConsumeAfterOpt = (Option *)SC_local;
      }
    }
    else {
      llvm::SmallVectorTemplateBase<llvm::cl::Option_*,_true>::push_back
                ((SmallVectorTemplateBase<llvm::cl::Option_*,_true> *)&pSStack_20->SinkOpts,
                 (Option **)&SC_local);
    }
  }
  pSVar8 = pSStack_20;
  if ((local_21 & 1) == 0) {
    pSVar7 = llvm::
             ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)llvm::cl::AllSubCommands);
    if (pSVar8 == pSVar7) {
      join_0x00000010_0x00000000_ =
           (SmallPtrSetIteratorImpl)
           llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                     (&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
      _Sub = (SmallPtrSetIteratorImpl)
             llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                       (&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>
                       );
      while (bVar2 = llvm::SmallPtrSetIteratorImpl::operator!=
                               ((SmallPtrSetIteratorImpl *)&__end3.super_SmallPtrSetIteratorImpl.End
                                ,(SmallPtrSetIteratorImpl *)&Sub), bVar2) {
        pSVar8 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                           ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                            &__end3.super_SmallPtrSetIteratorImpl.End);
        if (pSStack_20 != pSVar8) {
          addOption(this,(Option *)SC_local,pSVar8);
        }
        llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
                  ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                   &__end3.super_SmallPtrSetIteratorImpl.End);
      }
    }
    return;
  }
  llvm::report_fatal_error("inconsistency in registered CommandLine options",true);
}

Assistant:

void addOption(Option *O, SubCommand *SC) {
    bool HadErrors = false;
    if (O->hasArgStr()) {
      // Add argument to the argument map!
      if (!SC->OptionsMap.insert(std::make_pair(O->ArgStr, O)).second) {
        errs() << ProgramName << ": CommandLine Error: Option '" << O->ArgStr
               << "' registered more than once!\n";
        HadErrors = true;
      }
    }

    // Remember information about positional options.
    if (O->getFormattingFlag() == cl::Positional)
      SC->PositionalOpts.push_back(O);
    else if (O->getMiscFlags() & cl::Sink) // Remember sink options
      SC->SinkOpts.push_back(O);
    else if (O->getNumOccurrencesFlag() == cl::ConsumeAfter) {
      if (SC->ConsumeAfterOpt) {
        O->error("Cannot specify more than one option with cl::ConsumeAfter!");
        HadErrors = true;
      }
      SC->ConsumeAfterOpt = O;
    }

    // Fail hard if there were errors. These are strictly unrecoverable and
    // indicate serious issues such as conflicting option names or an
    // incorrectly
    // linked LLVM distribution.
    if (HadErrors)
      report_fatal_error("inconsistency in registered CommandLine options");

    // If we're adding this to all sub-commands, add it to the ones that have
    // already been registered.
    if (SC == &*AllSubCommands) {
      for (const auto Sub : RegisteredSubCommands) {
        if (SC == Sub)
          continue;
        addOption(O, Sub);
      }
    }
  }